

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3AllocateSegdirIdx(Fts3Table *p,int iLangid,int iIndex,int iLevel,int *piIdx)

{
  sqlite3_stmt *pStmt;
  int iVar1;
  sqlite3_int64 iValue;
  int local_3c;
  sqlite3_stmt *psStack_38;
  int iNext;
  sqlite3_stmt *pNextIdx;
  int *piStack_28;
  int rc;
  int *piIdx_local;
  int local_18;
  int iLevel_local;
  int iIndex_local;
  int iLangid_local;
  Fts3Table *p_local;
  
  local_3c = 0;
  piStack_28 = piIdx;
  piIdx_local._4_4_ = iLevel;
  local_18 = iIndex;
  iLevel_local = iLangid;
  _iIndex_local = p;
  pNextIdx._4_4_ = fts3SqlStmt(p,8,&stack0xffffffffffffffc8,(sqlite3_value **)0x0);
  pStmt = psStack_38;
  if (pNextIdx._4_4_ == 0) {
    iValue = getAbsoluteLevel(_iIndex_local,iLevel_local,local_18,piIdx_local._4_4_);
    sqlite3_bind_int64(pStmt,1,iValue);
    iVar1 = sqlite3_step(psStack_38);
    if (iVar1 == 100) {
      local_3c = sqlite3_column_int(psStack_38,0);
    }
    pNextIdx._4_4_ = sqlite3_reset(psStack_38);
  }
  if (pNextIdx._4_4_ == 0) {
    if (local_3c < 0x10) {
      *piStack_28 = local_3c;
    }
    else {
      pNextIdx._4_4_ = fts3SegmentMerge(_iIndex_local,iLevel_local,local_18,piIdx_local._4_4_);
      *piStack_28 = 0;
    }
  }
  return pNextIdx._4_4_;
}

Assistant:

static int fts3AllocateSegdirIdx(
  Fts3Table *p, 
  int iLangid,                    /* Language id */
  int iIndex,                     /* Index for p->aIndex */
  int iLevel, 
  int *piIdx
){
  int rc;                         /* Return Code */
  sqlite3_stmt *pNextIdx;         /* Query for next idx at level iLevel */
  int iNext = 0;                  /* Result of query pNextIdx */

  assert( iLangid>=0 );
  assert( p->nIndex>=1 );

  /* Set variable iNext to the next available segdir index at level iLevel. */
  rc = fts3SqlStmt(p, SQL_NEXT_SEGMENT_INDEX, &pNextIdx, 0);
  if( rc==SQLITE_OK ){
    sqlite3_bind_int64(
        pNextIdx, 1, getAbsoluteLevel(p, iLangid, iIndex, iLevel)
    );
    if( SQLITE_ROW==sqlite3_step(pNextIdx) ){
      iNext = sqlite3_column_int(pNextIdx, 0);
    }
    rc = sqlite3_reset(pNextIdx);
  }

  if( rc==SQLITE_OK ){
    /* If iNext is FTS3_MERGE_COUNT, indicating that level iLevel is already
    ** full, merge all segments in level iLevel into a single iLevel+1
    ** segment and allocate (newly freed) index 0 at level iLevel. Otherwise,
    ** if iNext is less than FTS3_MERGE_COUNT, allocate index iNext.
    */
    if( iNext>=FTS3_MERGE_COUNT ){
      fts3LogMerge(16, getAbsoluteLevel(p, iLangid, iIndex, iLevel));
      rc = fts3SegmentMerge(p, iLangid, iIndex, iLevel);
      *piIdx = 0;
    }else{
      *piIdx = iNext;
    }
  }

  return rc;
}